

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

ssize_t __thiscall
booster::locale::basic_message<char>::write
          (basic_message<char> *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  string *psVar2;
  char_type *pcVar3;
  string *psVar4;
  char_type *msg;
  facet_type *facet;
  char_type *plural;
  char_type *context;
  char_type *id;
  char_type *translated;
  basic_message<char> *in_stack_ffffffffffffff88;
  basic_message<char> *in_stack_ffffffffffffff90;
  string *buffer;
  string *in_stack_ffffffffffffff98;
  message_format<char> *pmVar5;
  char *local_30;
  char_type *local_8;
  
  local_30 = (char *)0x0;
  psVar2 = (string *)basic_message<char>::id(in_stack_ffffffffffffff90);
  pcVar3 = basic_message<char>::context(in_stack_ffffffffffffff88);
  psVar4 = (string *)basic_message<char>::plural(in_stack_ffffffffffffff88);
  if (*psVar2 == (string)0x0) {
    local_8 = "";
  }
  else {
    pmVar5 = (message_format<char> *)0x0;
    bVar1 = std::has_facet<booster::locale::message_format<char>>((locale *)0x0);
    if (bVar1) {
      pmVar5 = std::use_facet<booster::locale::message_format<char>>((locale *)this);
    }
    if (pmVar5 != (message_format<char> *)0x0) {
      if (psVar4 == (string *)0x0) {
        local_30 = (char *)(**(code **)(*(long *)pmVar5 + 0x10))
                                     (pmVar5,(ulong)__buf & 0xffffffff,pcVar3,psVar2);
      }
      else {
        local_30 = (char *)(**(code **)(*(long *)pmVar5 + 0x18))
                                     (pmVar5,(ulong)__buf & 0xffffffff,pcVar3,psVar2,this->n_);
      }
    }
    if (local_30 == (char *)0x0) {
      buffer = psVar2;
      if ((psVar4 != (string *)0x0) &&
         (buffer = psVar4, in_stack_ffffffffffffff98 = psVar4, this->n_ == 1)) {
        buffer = psVar2;
        in_stack_ffffffffffffff98 = psVar2;
      }
      if (pmVar5 == (message_format<char> *)0x0) {
        local_30 = details::string_cast_traits<char>::cast((char *)in_stack_ffffffffffffff98,buffer)
        ;
      }
      else {
        local_30 = (char *)(**(code **)(*(long *)pmVar5 + 0x28))(pmVar5,buffer,__n);
      }
    }
    local_8 = local_30;
  }
  return (ssize_t)local_8;
}

Assistant:

char_type const *write(std::locale const &loc,int domain_id,string_type &buffer) const
            {
                char_type const *translated = 0;
                static const char_type empty_string[1] = {0};

                char_type const *id = this->id();
                char_type const *context = this->context();
                char_type const *plural = this->plural();
                
                if(*id == 0)
                    return empty_string;
                
                facet_type const *facet = 0;
                if(std::has_facet<facet_type>(loc))
                    facet = &std::use_facet<facet_type>(loc);

                if(facet) { 
                    if(!plural) {
                        translated = facet->get(domain_id,context,id);
                    }
                    else {
                        translated = facet->get(domain_id,context,id,n_);
                    }
                }

                if(!translated) {
                    char_type const *msg = plural ? ( n_ == 1 ? id : plural) : id;

                    if(facet) {
                        translated = facet->convert(msg,buffer);
                    }
                    else {
                        translated = details::string_cast_traits<char_type>::cast(msg,buffer);
                    }
                }
                return translated;
            }